

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

int uv_thread_getaffinity(uv_thread_t *tid,char *cpumask,size_t mask_size)

{
  int iVar1;
  bool bVar2;
  size_t __cpu;
  undefined1 local_b0 [4];
  int cpumasksize;
  cpu_set_t cpuset;
  int i;
  int r;
  size_t mask_size_local;
  char *cpumask_local;
  uv_thread_t *tid_local;
  
  tid_local._4_4_ = uv_cpumask_size();
  if (-1 < tid_local._4_4_) {
    if (mask_size < (ulong)(long)tid_local._4_4_) {
      tid_local._4_4_ = -0x16;
    }
    else {
      memset(local_b0,0,0x80);
      iVar1 = pthread_getaffinity_np(*tid,0x80,(cpu_set_t *)local_b0);
      if (iVar1 == 0) {
        for (cpuset.__bits[0xf]._0_4_ = 0; (int)cpuset.__bits[0xf] < tid_local._4_4_;
            cpuset.__bits[0xf]._0_4_ = (int)cpuset.__bits[0xf] + 1) {
          if ((ulong)(long)(int)cpuset.__bits[0xf] >> 3 < 0x80) {
            bVar2 = (cpuset.__bits[((ulong)(long)(int)cpuset.__bits[0xf] >> 6) - 1] &
                    1L << ((byte)(int)cpuset.__bits[0xf] & 0x3f)) != 0;
          }
          else {
            bVar2 = false;
          }
          cpumask[(int)cpuset.__bits[0xf]] = bVar2;
        }
        tid_local._4_4_ = 0;
      }
      else {
        tid_local._4_4_ = -iVar1;
      }
    }
  }
  return tid_local._4_4_;
}

Assistant:

int uv_thread_getaffinity(uv_thread_t* tid,
                          char* cpumask,
                          size_t mask_size) {
  int r;
  int i;
  uv__cpu_set_t cpuset;
  int cpumasksize;

  cpumasksize = uv_cpumask_size();
  if (cpumasksize < 0)
    return cpumasksize;
  if (mask_size < (size_t)cpumasksize)
    return UV_EINVAL;

  CPU_ZERO(&cpuset);
#if defined(__ANDROID__)
  if (sched_getaffinity(pthread_gettid_np(*tid), sizeof(cpuset), &cpuset))
    r = errno;
  else
    r = 0;
#else
  r = pthread_getaffinity_np(*tid, sizeof(cpuset), &cpuset);
#endif
  if (r)
    return UV__ERR(r);
  for (i = 0; i < cpumasksize; i++)
    cpumask[i] = !!CPU_ISSET(i, &cpuset);

  return 0;
}